

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O3

void pltcalc::
     dopltcalc<pltcalc::outrec,std::map<int,std::vector<period_occ,std::allocator<period_occ>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<period_occ,std::allocator<period_occ>>>>>,period_occ>
               (summarySampleslevelHeader *sh,
               vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *vrec,
               _func_void_outrec_ptr_int_FILE_ptr *OutputData,FILE *outFile,
               map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
               *m_occ,vector<period_occ,_std::allocator<period_occ>_> *vp,
               OASIS_FLOAT max_impacted_exposure,OASIS_FLOAT mean_impacted_exposure,
               OASIS_FLOAT chance_of_loss,OASIS_FLOAT max_loss)

{
  pointer ppVar1;
  bool bVar2;
  mapped_type *__x;
  pointer psVar3;
  bool bVar4;
  pointer ppVar5;
  vector<sampleslevelRec,_std::allocator<sampleslevelRec>_> *__range4;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  outrec local_60;
  
  __x = std::
        map<int,_std::vector<period_occ,_std::allocator<period_occ>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<period_occ,_std::allocator<period_occ>_>_>_>_>
        ::operator[](m_occ,&sh->event_id);
  std::vector<period_occ,_std::allocator<period_occ>_>::operator=(vp,__x);
  local_60.event_id = sh->event_id;
  local_60.summary_id = sh->summary_id;
  local_60.exp_value = sh->expval;
  local_60.mean = 0.0;
  local_60.standard_deviation = 0.0;
  ppVar5 = (vp->super__Vector_base<period_occ,_std::allocator<period_occ>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ppVar1 = (vp->super__Vector_base<period_occ,_std::allocator<period_occ>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    bVar2 = true;
    bVar4 = false;
    fVar8 = 0.0;
    fVar9 = 0.0;
    local_60.max_impact_exp = max_impacted_exposure;
    local_60.mean_impact_exp = mean_impacted_exposure;
    local_60.chance_of_loss = chance_of_loss;
    local_60.max_loss = max_loss;
    do {
      local_60.period_no = ppVar5->period_no;
      local_60.occ_date_id = ppVar5->occ_date_id;
      if (bVar2) {
        for (psVar3 = (vrec->super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            psVar3 != (vrec->super__Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>).
                      _M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
          if (0 < psVar3->sidx) {
            fVar6 = psVar3->loss;
            fVar9 = fVar9 + fVar6;
            fVar8 = fVar8 + fVar6 * fVar6;
          }
          bVar4 = (bool)(bVar4 | 0 < psVar3->sidx);
        }
      }
      if (bVar4) {
        fVar7 = fVar9 / (float)samplesize_;
        local_60.mean = fVar7;
        fVar6 = 0.0;
        if (samplesize_ != 1) {
          fVar7 = (fVar8 - (fVar9 * fVar9) / (float)samplesize_) / (float)(samplesize_ + -1);
          fVar6 = 0.0;
          if (1e-07 <= fVar7 / fVar8) {
            fVar6 = fVar7;
          }
          if (fVar6 < 0.0) {
            fVar6 = sqrtf(fVar6);
          }
          else {
            fVar6 = SQRT(fVar6);
          }
          fVar7 = local_60.mean;
        }
        local_60.standard_deviation = fVar6;
        if ((0.0 < fVar6) || (0.0 < fVar7)) {
          (*OutputData)(&local_60,2,outFile);
        }
      }
      ppVar5 = ppVar5 + 1;
      bVar2 = false;
    } while (ppVar5 != ppVar1);
  }
  return;
}

Assistant:

void dopltcalc(const summarySampleslevelHeader& sh,
		       const std::vector<sampleslevelRec>& vrec,
		       void (*OutputData)(const outrecT&, const int, FILE*),
		       FILE * outFile, moccT &m_occ, std::vector<periodT> &vp,
		       const OASIS_FLOAT max_impacted_exposure,
		       const OASIS_FLOAT mean_impacted_exposure,
		       const OASIS_FLOAT chance_of_loss,
		       const OASIS_FLOAT max_loss)
	{
		vp = m_occ[sh.event_id];
		bool hasrec = false;
		bool firsttime = true;
		outrecT o;
		o.event_id = sh.event_id;
		o.summary_id = sh.summary_id;
		o.exp_value = sh.expval;
		o.max_impact_exp = max_impacted_exposure;
		o.mean_impact_exp = mean_impacted_exposure;
		o.chance_of_loss = chance_of_loss;
		o.max_loss = max_loss;
		o.mean = 0;
		o.standard_deviation = 0;

		OASIS_FLOAT squared_loss_sum = 0;
		OASIS_FLOAT loss_sum = 0;
		for (auto p : vp) {
			o.period_no = p.period_no;
			o.occ_date_id = p.occ_date_id;
			if (firsttime == true) { // only do this once
				for (auto v : vrec) {
					if (v.sidx > 0) {
						hasrec = true;
						loss_sum += v.loss;
						squared_loss_sum += (v.loss * v.loss);
					}
				}
				firsttime = false;
			}
			if (hasrec) {
				o.mean = loss_sum / samplesize_;
				if (samplesize_ != 1) {
					OASIS_FLOAT sd = (squared_loss_sum - ((loss_sum * loss_sum) / samplesize_)) / (samplesize_ - 1);
					OASIS_FLOAT x = sd / squared_loss_sum;
					if (x < 0.0000001) sd = 0;   // fix OASIS_FLOATing point precision problems caused by using large numbers
					o.standard_deviation = sqrt(sd);
				} else {
					o.standard_deviation = 0;
				}
				if (o.mean > 0 || o.standard_deviation > 0) {
					OutputData(o, 2, outFile);
				}
			}
		}
	}